

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.c
# Opt level: O0

void horizontalHaar(uint8_t *_src,uint8_t *_dst,int rows,int cols)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int16_t iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  size_t col_1;
  int16_t *tmp2;
  int16_t *tmp1;
  size_t col;
  int aligned;
  int16_t *dptr;
  int16_t *sptr;
  size_t row;
  int16_t *dst;
  int16_t *src;
  __m256i mask;
  ulong local_110;
  long local_f8;
  ulong local_d8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
  auVar2 = vpinsrd_avx(auVar2,4,2);
  auVar2 = vpinsrd_avx(auVar2,5,3);
  auVar3 = vpinsrd_avx(ZEXT416(2),3,1);
  auVar3 = vpinsrd_avx(auVar3,6,2);
  auVar3 = vpinsrd_avx(auVar3,7,3);
  auVar12 = ZEXT1664(auVar3);
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  for (local_d8 = 0; uStack_a8 = auVar10._8_8_, uStack_b0 = auVar10._0_8_,
      local_d8 < (ulong)(long)in_EDX; local_d8 = local_d8 + 1) {
    lVar8 = in_RDI + local_d8 * (long)in_ECX * 2;
    lVar9 = in_RSI + local_d8 * (long)in_ECX * 2;
    auVar12 = ZEXT1664(auVar12._0_16_);
    iVar7 = align32(in_ECX);
    for (local_f8 = 0; local_f8 != iVar7; local_f8 = local_f8 + 0x20) {
      auVar5._16_8_ = uStack_b0;
      auVar5._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
      auVar5._24_8_ = uStack_a8;
      auVar11 = *(undefined1 (*) [32])(lVar8 + local_f8 * 2);
      auVar1 = *(undefined1 (*) [32])(lVar8 + 0x20 + local_f8 * 2);
      auVar4 = vphsubw_avx2(auVar12._0_32_,auVar1,auVar11);
      auVar11 = vphaddw_avx2(auVar1,auVar11);
      auVar11 = vpsraw_avx2(auVar11,1);
      auVar11 = vpermd_avx2(auVar5,auVar11);
      auVar1 = vpermd_avx2(auVar5,auVar4);
      auVar12 = ZEXT3264(auVar1);
      *(undefined1 (*) [32])(lVar9 + local_f8) = auVar11;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])(lVar9 + local_f8) + (long)(in_ECX / 2) * 2) =
           auVar1;
    }
    for (local_110 = (ulong)iVar7; local_110 < (ulong)(long)(in_ECX + -1); local_110 = local_110 + 2
        ) {
      auVar12 = ZEXT1664(auVar12._0_16_);
      iVar6 = floor2(*(short *)(lVar8 + 2 + local_110 * 2) + *(short *)(lVar8 + local_110 * 2));
      *(int16_t *)(lVar9 + (local_110 & 0xfffffffffffffffe)) = iVar6;
      *(short *)(lVar9 + (long)(in_ECX / 2) * 2 + (local_110 & 0xfffffffffffffffe)) =
           *(short *)(lVar8 + local_110 * 2) - *(short *)(lVar8 + 2 + local_110 * 2);
    }
    if (in_ECX % 2 != 0) {
      *(undefined2 *)(lVar9 + (long)(in_ECX + -1) * 2) =
           *(undefined2 *)(lVar8 + (long)(in_ECX + -1) * 2);
    }
  }
  return;
}

Assistant:

void horizontalHaar(const uint8_t* IMAGESTEGO_RESTRICT _src, uint8_t* IMAGESTEGO_RESTRICT _dst, const int rows,
        const int cols) {
    __m256i mask = _mm256_set_epi32(5, 4, 1, 0, 7, 6, 3, 2);
    const int16_t* src = (const int16_t*) _src;
    int16_t* dst = (int16_t*) _dst;
    for (size_t row = 0; row < rows; ++row) {
        const int16_t* sptr = src + row * cols;
        int16_t* dptr = dst + row * cols;
        const int aligned = align32(cols);
        for (size_t col = 0; col != aligned; col += 32) {
            int16_t* tmp1 = dptr + col / 2, * tmp2 = tmp1 + cols / 2;
#if IMAGESTEGO_GCC || IMAGESTEGO_CLANG || IMAGESTEGO_ICC
            asm(
                "vmovdqu (%[src], %[col], 2), %%ymm0  \n\t"
                "vmovdqu 32(%[src], %[col], 2), %%ymm1\n\t"
                "vphsubw %%ymm0, %%ymm1, %%ymm2       \n\t"
                "vphaddw %%ymm0, %%ymm1, %%ymm1       \n\t"
                "vpsraw  $0x1, %%ymm1, %%ymm1         \n\t"
                "vpermd  %%ymm1, %[mask], %%ymm1      \n\t"
                "vpermd  %%ymm2, %[mask], %%ymm2      \n\t"
                "vmovdqu %%ymm1, (%[lo])              \n\t"
                "vmovdqu %%ymm2, (%[hi])              \n\t"
                :
                : [lo]   "r" (tmp1),
                  [hi]   "r" (tmp2),
                  [src]  "r" (sptr),
                  [mask] "x" (mask),
                  [col]  "r" ((ptrdiff_t) col)
                : "%ymm0", "%ymm1", "%ymm2", "memory"
            );
#else // MSVC doesn't support inline asm for x64
            const __m256i a = _mm256_loadu_si256((const __m256i*) (src + col)),
                          b = _mm256_loadu_si256((const __m256i*) (src + col + 16));
            const __m256i lo = _mm256_srai_epi16(_mm256_hadd_epi16(b, a), 1),
                          hi = _mm256_hsub_epi16(b, a);
            _mm256_storeu_si256((__m256i*) tmp1, _mm256_permutevar8x32_epi32(lo, mask));
            _mm256_storeu_si256((__m256i*) tmp2, _mm256_permutevar8x32_epi32(hi, mask));
#endif
        }
        // TODO: implement with AVX512 if possible
        for (size_t col = aligned; col < cols - 1; col += 2) {
            *(dptr + col / 2) = floor2(sptr[col + 1] + sptr[col]);
            *(dptr + cols / 2 + col / 2) = sptr[col] - sptr[col + 1];
        }
        if (cols % 2 != 0) {
            dptr[cols - 1] = sptr[cols - 1];
        }
    }
}